

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

pair<QDate,_QTime> getDateTime(QDateTimeData *d)

{
  long lVar1;
  QDateTimePrivate *pQVar2;
  qint64 a;
  R_conflict15 RVar3;
  pair<QDate,_QTime> pVar4;
  
  pQVar2 = d->d;
  if (((ulong)pQVar2 & 1) == 0) {
    a = pQVar2->m_msecs;
    pQVar2 = (QDateTimePrivate *)
             (ulong)(pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    a = (long)pQVar2 >> 8;
  }
  RVar3 = QRoundingDown::qDivMod<86400000U,_long_long,_true>(a);
  lVar1 = RVar3.quotient + 0x253d8c;
  if (RVar3.quotient - 0xb69eff42c9U < 0xfffffe92c1eb868c) {
    lVar1 = -0x8000000000000000;
  }
  if (((ulong)pQVar2 & 2) == 0) {
    lVar1 = -0x8000000000000000;
  }
  pVar4.second.mds = (uint)RVar3.remainder | -(uint)(((ulong)pQVar2 & 4) == 0);
  pVar4.first.jd = lVar1;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}